

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O2

string * __thiscall
fakeit::MockImpl<IMessageHolder>::MethodMockingContextBase<unsigned_long>::getMethodName_abi_cxx11_
          (string *__return_storage_ptr__,MethodMockingContextBase<unsigned_long> *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*(this->super_Context).super_Destructible._vptr_Destructible[9])(this);
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)(CONCAT44(extraout_var,iVar1) + 0x28));
  return __return_storage_ptr__;
}

Assistant:

std::string getMethodName() {
                return getRecordedMethodBody().getMethod().name();
            }